

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O0

void __thiscall
spvtools::disassemble::InstructionDisassembler::EmitMaskOperand
          (InstructionDisassembler *this,ostream *stream,spv_operand_type_t type,uint32_t word)

{
  spv_result_t sVar1;
  spv_operand_desc local_40;
  spv_operand_desc entry_1;
  spv_operand_desc entry;
  uint local_28;
  int num_emitted;
  uint32_t mask;
  uint32_t remaining_word;
  uint32_t word_local;
  spv_operand_type_t type_local;
  ostream *stream_local;
  InstructionDisassembler *this_local;
  
  entry._4_4_ = 0;
  local_28 = 1;
  num_emitted = word;
  mask = word;
  remaining_word = type;
  _word_local = stream;
  stream_local = (ostream *)this;
  do {
    if (num_emitted == 0) {
      if ((entry._4_4_ == 0) &&
         (sVar1 = AssemblyGrammar::lookupOperand(this->grammar_,remaining_word,0,&local_40),
         sVar1 == SPV_SUCCESS)) {
        std::operator<<(_word_local,local_40->name);
      }
      return;
    }
    if ((num_emitted & local_28) != 0) {
      num_emitted = local_28 ^ num_emitted;
      sVar1 = AssemblyGrammar::lookupOperand(this->grammar_,remaining_word,local_28,&entry_1);
      if (sVar1 != SPV_SUCCESS) {
        __assert_fail("false && \"should have caught this earlier\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/disassemble.cpp"
                      ,0x3e4,
                      "void spvtools::disassemble::InstructionDisassembler::EmitMaskOperand(std::ostream &, const spv_operand_type_t, const uint32_t) const"
                     );
      }
      if (entry._4_4_ != 0) {
        std::operator<<(_word_local,"|");
      }
      std::operator<<(_word_local,entry_1->name);
      entry._4_4_ = entry._4_4_ + 1;
    }
    local_28 = local_28 << 1;
  } while( true );
}

Assistant:

void InstructionDisassembler::EmitMaskOperand(std::ostream& stream,
                                              const spv_operand_type_t type,
                                              const uint32_t word) const {
  // Scan the mask from least significant bit to most significant bit.  For each
  // set bit, emit the name of that bit. Separate multiple names with '|'.
  uint32_t remaining_word = word;
  uint32_t mask;
  int num_emitted = 0;
  for (mask = 1; remaining_word; mask <<= 1) {
    if (remaining_word & mask) {
      remaining_word ^= mask;
      spv_operand_desc entry;
      if (grammar_.lookupOperand(type, mask, &entry))
        assert(false && "should have caught this earlier");
      if (num_emitted) stream << "|";
      stream << entry->name;
      num_emitted++;
    }
  }
  if (!num_emitted) {
    // An operand value of 0 was provided, so represent it by the name
    // of the 0 value. In many cases, that's "None".
    spv_operand_desc entry;
    if (SPV_SUCCESS == grammar_.lookupOperand(type, 0, &entry))
      stream << entry->name;
  }
}